

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O2

CURLcode easysrc_perform(void)

{
  curl_slist *pcVar1;
  CURLcode CVar2;
  long lVar3;
  slist_wc *psVar4;
  
  if (easysrc_toohard != (slist_wc *)0x0) {
    CVar2 = easysrc_add(&easysrc_code,"");
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    lVar3 = 0;
    while (lVar3 != 0x20) {
      CVar2 = easysrc_add(&easysrc_code,*(char **)((long)srchard + lVar3));
      lVar3 = lVar3 + 8;
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    }
    psVar4 = easysrc_toohard;
    if (easysrc_toohard != (slist_wc *)0x0) {
      while (pcVar1 = psVar4->first, pcVar1 != (curl_slist *)0x0) {
        CVar2 = easysrc_add(&easysrc_code,pcVar1->data);
        psVar4 = (slist_wc *)&pcVar1->next;
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
      }
    }
    CVar2 = easysrc_add(&easysrc_code,"");
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    CVar2 = easysrc_add(&easysrc_code,"*/");
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = (slist_wc *)0x0;
  }
  CVar2 = easysrc_add(&easysrc_code,"");
  if ((CVar2 == CURLE_OK) &&
     (CVar2 = easysrc_add(&easysrc_code,"ret = curl_easy_perform(hnd);"), CVar2 == CURLE_OK)) {
    CVar2 = easysrc_add(&easysrc_code,"");
    return CVar2;
  }
  return CVar2;
}

Assistant:

CURLcode easysrc_perform(void)
{
  /* Note any setopt calls which we could not convert */
  if(easysrc_toohard) {
    int i;
    struct curl_slist *ptr;
    const char *c;
    CHKRET(easysrc_add(&easysrc_code, ""));
    /* Preamble comment */
    for(i = 0; ((c = srchard[i]) != NULL); i++)
      CHKRET(easysrc_add(&easysrc_code, c));
    /* Each unconverted option */
    if(easysrc_toohard) {
      for(ptr = easysrc_toohard->first; ptr; ptr = ptr->next)
        CHKRET(easysrc_add(&easysrc_code, ptr->data));
    }
    CHKRET(easysrc_add(&easysrc_code, ""));
    CHKRET(easysrc_add(&easysrc_code, "*/"));

    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = NULL;
  }

  CHKRET(easysrc_add(&easysrc_code, ""));
  CHKRET(easysrc_add(&easysrc_code, "ret = curl_easy_perform(hnd);"));
  CHKRET(easysrc_add(&easysrc_code, ""));

  return CURLE_OK;
}